

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O1

int Msat_ClauseSimplify(Msat_Clause_t *pC,int *pAssigns)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar7;
  ulong uVar6;
  
  uVar4 = *(uint *)&pC->field_0x4;
  uVar2 = 0;
  uVar5 = uVar4 >> 3 & 0x3fff;
  uVar6 = (ulong)uVar5;
  if (uVar5 != 0) {
    uVar3 = 0;
    uVar2 = 0;
    do {
      iVar1 = (&pC[1].Num)[uVar3];
      if (pAssigns[iVar1 >> 1] == -1) {
        lVar7 = (long)(int)uVar2;
        uVar2 = uVar2 + 1;
        (&pC[1].Num)[lVar7] = iVar1;
      }
      else {
        if (pAssigns[iVar1 >> 1] == iVar1) {
          return 1;
        }
        if (uVar3 < 2) {
          __assert_fail("i >= 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                        ,0x186,"int Msat_ClauseSimplify(Msat_Clause_t *, int *)");
        }
      }
      uVar3 = uVar3 + 1;
      uVar4 = *(uint *)&pC->field_0x4;
      uVar6 = (ulong)(uVar4 >> 3 & 0x3fff);
    } while (uVar3 < uVar6);
  }
  if ((int)uVar2 < (int)uVar6) {
    iVar1 = (&pC[1].Num)[uVar6];
    *(uint *)&pC->field_0x4 = (uVar4 & 0xfffe0007) + (uVar2 & 0x3fff) * 8;
    (&pC[1].Num)[uVar2 & 0x3fff] = iVar1;
  }
  return 0;
}

Assistant:

int  Msat_ClauseSimplify( Msat_Clause_t * pC, int * pAssigns )
{
    Msat_Var_t Var;
    int i, j;
    for ( i = j = 0; i < (int)pC->nSize; i++ )
    {
        Var = MSAT_LIT2VAR(pC->pData[i]);
        if ( pAssigns[Var] == MSAT_VAR_UNASSIGNED )
        {
            pC->pData[j++] = pC->pData[i];
            continue;
        }
        if ( pAssigns[Var] == pC->pData[i] )
            return 1;
        // otherwise, the value of the literal is false
        // make sure, this literal is not watched
        assert( i >= 2 );
    }
    // if the size has changed, update it and move activity
    if ( j < (int)pC->nSize )
    {
        float Activ = Msat_ClauseReadActivity(pC);
        pC->nSize = j;
        Msat_ClauseWriteActivity(pC, Activ);
    }
    return 0;
}